

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetConfigurable
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  bool bVar1;
  ObjectSlotAttributes propertyAttributes;
  uint16 uVar2;
  PropertyIndex propertyIndex_00;
  int iVar3;
  BOOL BVar4;
  TypePath *this_00;
  ScriptContext *this_01;
  PropertyRecord *this_02;
  undefined4 extraout_var;
  ObjectSlotAttributes **ppOVar5;
  ObjectSlotAttributes attr;
  PropertyRecord *propertyRecord;
  PropertyIndex propertyIndex;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  this_00 = PathTypeHandlerBase::GetTypePath((PathTypeHandlerBase *)this);
  uVar2 = PathTypeHandlerBase::GetPathLength((PathTypeHandlerBase *)this);
  propertyIndex_00 = TypePath::LookupInline(this_00,propertyId,(uint)uVar2);
  if (propertyIndex_00 == 0xffff) {
    if ((value == 0) && (bVar1 = DynamicObject::HasObjectArray(instance), bVar1)) {
      this_01 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
      this_02 = ScriptContext::GetPropertyName(this_01,propertyId);
      bVar1 = PropertyRecord::IsNumeric(this_02);
      if (bVar1) {
        iVar3 = (*(this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x48])(this,instance);
        BVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x158))
                          ((long *)CONCAT44(extraout_var,iVar3),instance,propertyId,0);
        return BVar4;
      }
    }
    this_local._4_4_ = 1;
  }
  else {
    if (value == 0) {
      ppOVar5 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                          ((WriteBarrierPtr *)&this->attributes);
      propertyAttributes = (*ppOVar5)[propertyIndex_00] & ~ObjectSlotAttr_Configurable;
    }
    else {
      ppOVar5 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                          ((WriteBarrierPtr *)&this->attributes);
      propertyAttributes = (*ppOVar5)[propertyIndex_00] | ObjectSlotAttr_Configurable;
    }
    ppOVar5 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                        ((WriteBarrierPtr *)&this->attributes);
    this_local._4_4_ =
         PathTypeHandlerBase::SetAttributesHelper
                   ((PathTypeHandlerBase *)this,instance,propertyId,propertyIndex_00,*ppOVar5,
                    propertyAttributes,false);
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetConfigurable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        // Find the property
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            if (!value)
            {
                // Upgrade type handler if set objectArray item attribute.
                // Only check numeric propertyId if objectArray available.
                if (instance->HasObjectArray())
                {
                    PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                    if (propertyRecord->IsNumeric())
                    {
                        return ConvertToTypeWithItemAttributes(instance)->SetConfigurable(instance, propertyId, value);
                    }
                }
            }
            return true;
        }

        ObjectSlotAttributes attr =
            (ObjectSlotAttributes)(value ? (attributes[propertyIndex] | ObjectSlotAttr_Configurable) : (attributes[propertyIndex] & ~ObjectSlotAttr_Configurable));
        return SetAttributesHelper(instance, propertyId, propertyIndex, attributes, attr);
    }